

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_boost(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_power_boost_entry *peVar2;
  envy_bios_power_boost_subentry *peVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = (bios->power).boost.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar4 = (ulong)(bios->power).boost.version;
  if ((bios->power).boost.valid != '\0') {
    fprintf((FILE *)out,"BOOST table at 0x%x, version %x\n",(ulong)uVar1,uVar4);
    envy_bios_dump_hex(bios,out,(bios->power).boost.offset,(uint)(bios->power).boost.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).boost.entriesnum != '\0') {
      uVar4 = 0;
      do {
        peVar2 = (bios->power).boost.entries;
        fprintf((FILE *)out,"\t%i: pstate %x min %d MHz max %d MHz\n",uVar4,
                (ulong)peVar2[uVar4].pstate,(ulong)peVar2[uVar4].min,(ulong)peVar2[uVar4].max);
        envy_bios_dump_hex(bios,out,(bios->power).boost.entries[uVar4].offset,
                           (uint)(bios->power).boost.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        if ((bios->power).boost.snr != '\0') {
          lVar5 = 8;
          uVar6 = 0;
          do {
            peVar3 = (bios->power).boost.entries[uVar4].entries;
            fprintf(_stdout,"\t\t%i: domain %x percent %d min %d max %d\n",uVar6 & 0xffffffff,
                    (ulong)*(byte *)((long)peVar3 + lVar5 + -4),
                    (ulong)*(byte *)((long)peVar3 + lVar5 + -3),
                    (ulong)*(ushort *)((long)peVar3 + lVar5 + -2),
                    (uint)*(ushort *)((long)&peVar3->offset + lVar5));
            envy_bios_dump_hex(bios,out,*(uint *)((long)peVar3 + lVar5 + -8),
                               (uint)(bios->power).boost.ssz,mask);
            if ((int)mask < 0) {
              fputc(10,(FILE *)out);
            }
            uVar6 = uVar6 + 1;
            lVar5 = lVar5 + 0xc;
          } while (uVar6 < (bios->power).boost.snr);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (bios->power).boost.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse BOOST table at 0x%x, version %x\n",(ulong)uVar1,uVar4);
  return;
}

Assistant:

void envy_bios_print_power_boost(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_boost *boost = &bios->power.boost;
	int i, j;

	if (!boost->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!boost->valid) {
		fprintf(out, "Failed to parse BOOST table at 0x%x, version %x\n", boost->offset, boost->version);
		return;
	}

	fprintf(out, "BOOST table at 0x%x, version %x\n", boost->offset, boost->version);
	envy_bios_dump_hex(bios, out, boost->offset, boost->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < boost->entriesnum; i++) {
		fprintf(out, "	%i: pstate %x min %d MHz max %d MHz\n", i,
			boost->entries[i].pstate, boost->entries[i].min,
			boost->entries[i].max);
		envy_bios_dump_hex(bios, out, boost->entries[i].offset, boost->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");


		for (j = 0; j < boost->snr; j++) {
			struct envy_bios_power_boost_subentry *sub = &boost->entries[i].entries[j];
			fprintf(stdout, "		%i: domain %x percent %d min %d max %d\n",
				j, sub->domain, sub->percent, sub->min, sub->max);
			envy_bios_dump_hex(bios, out, sub->offset, boost->ssz, mask);
			if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
		}
	}

	fprintf(out, "\n");
}